

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# first_last_any.cpp
# Opt level: O2

void __thiscall
duckdb::FirstVectorFunction<true,_false>::Update
          (FirstVectorFunction<true,_false> *this,Vector *inputs,AggregateInputData *input_data,
          idx_t param_3,Vector *state_vector,idx_t count)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined1 is_null;
  idx_t i;
  Vector *pVVar4;
  data_ptr_t pdVar5;
  bool bVar6;
  string_t value;
  LogicalType LStack_2138;
  UnifiedVectorFormat sdata;
  UnifiedVectorFormat idata;
  Vector sort_key;
  sel_t assign_sel [2048];
  
  is_null = (undefined1)count;
  UnifiedVectorFormat::UnifiedVectorFormat(&idata);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)state_vector,&idata);
  UnifiedVectorFormat::UnifiedVectorFormat(&sdata);
  Vector::ToUnifiedFormat((Vector *)param_3,(idx_t)state_vector,&sdata);
  for (pVVar4 = (Vector *)0x0; state_vector != pVVar4; pVVar4 = (Vector *)&pVVar4->field_0x1) {
    uVar1 = NumericCastImpl<unsigned_int,_unsigned_long,_false>::Convert((unsigned_long)pVVar4);
    assign_sel[(long)pVVar4] = uVar1;
  }
  if (state_vector != (Vector *)0x0) {
    LogicalType::LogicalType(&LStack_2138,BLOB);
    Vector::Vector(&sort_key,&LStack_2138,0x800);
    LogicalType::~LogicalType(&LStack_2138);
    CreateSortKeyHelpers::CreateSortKey
              ((Vector *)this,(idx_t)state_vector,(OrderModifiers)0x302,&sort_key);
    pdVar5 = sort_key.data + 8;
    for (pVVar4 = (Vector *)0x0; state_vector != pVVar4; pVVar4 = (Vector *)&pVVar4->field_0x1) {
      uVar3 = (ulong)assign_sel[(long)pVVar4];
      uVar2 = uVar3;
      if ((sdata.sel)->sel_vector != (sel_t *)0x0) {
        uVar2 = (ulong)(sdata.sel)->sel_vector[uVar3];
      }
      if ((idata.sel)->sel_vector != (sel_t *)0x0) {
        uVar3 = (ulong)(idata.sel)->sel_vector[uVar3];
      }
      if (idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
          (unsigned_long *)0x0) {
        bVar6 = false;
      }
      else {
        bVar6 = (idata.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar3 >> 6]
                 >> (uVar3 & 0x3f) & 1) == 0;
      }
      value.value.inlined.inlined[4] = bVar6;
      value.value._0_8_ = *(undefined8 *)pdVar5;
      value.value._9_7_ = 0;
      FirstFunctionStringBase<true,false>::SetValue<duckdb::FirstState<duckdb::string_t>,false>
                (*(FirstFunctionStringBase<true,false> **)(sdata.data + uVar2 * 8),
                 (FirstState<duckdb::string_t> *)inputs,*(AggregateInputData **)(pdVar5 + -8),value,
                 (bool)is_null);
      pdVar5 = pdVar5 + 0x10;
    }
    Vector::~Vector(&sort_key);
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&sdata);
  UnifiedVectorFormat::~UnifiedVectorFormat(&idata);
  return;
}

Assistant:

static void Update(Vector inputs[], AggregateInputData &input_data, idx_t, Vector &state_vector, idx_t count) {
		auto &input = inputs[0];
		UnifiedVectorFormat idata;
		input.ToUnifiedFormat(count, idata);

		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);

		sel_t assign_sel[STANDARD_VECTOR_SIZE];
		idx_t assign_count = 0;

		auto states = UnifiedVectorFormat::GetData<STATE *>(sdata);
		for (idx_t i = 0; i < count; i++) {
			const auto idx = idata.sel->get_index(i);
			bool is_null = !idata.validity.RowIsValid(idx);
			if (SKIP_NULLS && is_null) {
				continue;
			}
			auto &state = *states[sdata.sel->get_index(i)];
			if (!LAST && state.is_set) {
				continue;
			}
			assign_sel[assign_count++] = NumericCast<sel_t>(i);
		}
		if (assign_count == 0) {
			// fast path - nothing to set
			return;
		}

		Vector sort_key(LogicalType::BLOB);
		OrderModifiers modifiers(OrderType::ASCENDING, OrderByNullType::NULLS_LAST);
		// slice with a selection vector and generate sort keys
		if (assign_count == count) {
			CreateSortKeyHelpers::CreateSortKey(input, count, modifiers, sort_key);
		} else {
			SelectionVector sel(assign_sel);
			Vector sliced_input(input, sel, assign_count);
			CreateSortKeyHelpers::CreateSortKey(sliced_input, assign_count, modifiers, sort_key);
		}
		auto sort_key_data = FlatVector::GetData<string_t>(sort_key);

		// now assign sort keys
		for (idx_t i = 0; i < assign_count; i++) {
			const auto state_idx = sdata.sel->get_index(assign_sel[i]);
			auto &state = *states[state_idx];
			if (!LAST && state.is_set) {
				continue;
			}

			const auto idx = idata.sel->get_index(assign_sel[i]);
			bool is_null = !idata.validity.RowIsValid(idx);
			FirstFunctionStringBase<LAST, SKIP_NULLS>::template SetValue<STATE>(state, input_data, sort_key_data[i],
			                                                                    is_null);
		}
	}